

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_stack.hpp
# Opt level: O0

void __thiscall
asio::detail::call_stack<asio::detail::thread_context,_asio::detail::thread_info_base>::context::
context(context *this,thread_context *k,thread_info_base *v)

{
  noncopyable *pnVar1;
  context *pcVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  noncopyable *in_RDI;
  context *in_stack_ffffffffffffffb8;
  
  noncopyable::noncopyable(in_RDI);
  *(undefined8 *)in_RDI = in_RSI;
  *(undefined8 *)(in_RDI + 8) = in_RDX;
  pnVar1 = in_RDI + 0x10;
  pcVar2 = keyword_tss_ptr::operator_cast_to_context_
                     ((keyword_tss_ptr<asio::detail::call_stack<asio::detail::thread_context,_asio::detail::thread_info_base>::context>
                       *)0x3d7f3d);
  *(context **)pnVar1 = pcVar2;
  tss_ptr<asio::detail::call_stack<asio::detail::thread_context,_asio::detail::thread_info_base>::context>
  ::operator=((tss_ptr<asio::detail::call_stack<asio::detail::thread_context,_asio::detail::thread_info_base>::context>
               *)in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

context(Key* k, Value& v)
      : key_(k),
        value_(&v),
        next_(call_stack<Key, Value>::top_)
    {
      call_stack<Key, Value>::top_ = this;
    }